

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::FirstMatchSequenceExprSyntax::setChild
          (FirstMatchSequenceExprSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_0041e394 + *(int *)(&DAT_0041e394 + index * 4)))();
  return;
}

Assistant:

void FirstMatchSequenceExprSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: first_match = child.token(); return;
        case 1: openParen = child.token(); return;
        case 2: expr = child.node() ? &child.node()->as<SequenceExprSyntax>() : nullptr; return;
        case 3: matchList = child.node() ? &child.node()->as<SequenceMatchListSyntax>() : nullptr; return;
        case 4: closeParen = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}